

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool __thiscall QObject::event(QObject *this,QEvent *e)

{
  ushort uVar1;
  QAbstractEventDispatcher *this_00;
  Data *pDVar2;
  TimerInfoV2 *pTVar3;
  qsizetype qVar4;
  QSlotObjectBase *slotObj;
  bool bVar5;
  QTypedArrayData<QAbstractEventDispatcher::TimerInfoV2> *__old_val;
  longlong __old_val_2;
  TimerInfoV2 *__old_val_1;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> local_98;
  undefined1 local_78 [8];
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> QStack_70;
  QObject **local_58;
  char *pcStack_50;
  QMetaTypeInterface *local_48 [2];
  QBindingStorageData *local_38;
  
  local_38 = *(QBindingStorageData **)(in_FS_OFFSET + 0x28);
  uVar1 = e->t;
  if ((uVar1 - 0x44 < 2) || (uVar1 == 0x47)) {
    (*this->_vptr_QObject[8])(this,e);
  }
  else {
    if (uVar1 == 0x16) {
      this_00 = (QAbstractEventDispatcher *)(this->d_ptr).d[1].q_ptr[6]._vptr_QObject;
      bVar5 = true;
      if (this_00 != (QAbstractEventDispatcher *)0x0) {
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (TimerInfoV2 *)&DAT_aaaaaaaaaaaaaaaa;
        QAbstractEventDispatcher::timersForObject
                  ((QList<QAbstractEventDispatcher::TimerInfoV2> *)&local_98,this_00,this);
        if ((Data *)local_98.size != (Data *)0x0) {
          (**(code **)(*(long *)this_00 + 0x88))(this_00,this);
          qVar4 = local_98.size;
          pTVar3 = local_98.ptr;
          pDVar2 = local_98.d;
          local_98.d = (Data *)0x0;
          QStack_70.d = pDVar2;
          local_98.ptr = (TimerInfoV2 *)0x0;
          local_98.size = 0;
          QStack_70.ptr = pTVar3;
          QStack_70.size = qVar4;
          local_58 = (QObject **)0x0;
          pcStack_50 = (char *)0x0;
          local_48[0] = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
          local_78 = (undefined1  [8])this;
          slotObj = (QSlotObjectBase *)operator_new(0x30);
          (slotObj->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i = 1;
          slotObj->m_impl =
               QtPrivate::
               QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qobject.cpp:1445:41),_QtPrivate::List<>,_void>
               ::impl;
          *(QObject **)(slotObj + 1) = this;
          QStack_70.d = (Data *)0x0;
          slotObj[1].m_impl = (ImplFn)pDVar2;
          QStack_70.ptr = (TimerInfoV2 *)0x0;
          *(TimerInfoV2 **)(slotObj + 2) = pTVar3;
          QStack_70.size = 0;
          slotObj[2].m_impl = (ImplFn)qVar4;
          QMetaObject::invokeMethodImpl
                    (this,slotObj,QueuedConnection,1,&local_58,&pcStack_50,local_48);
          QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::~QArrayDataPointer(&QStack_70);
        }
        QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::~QArrayDataPointer(&local_98);
      }
      goto LAB_00289bbb;
    }
    if (uVar1 == 0x2b) {
      pQVar6 = (this->d_ptr).d[1].parent;
      if (pQVar6 == (QObject *)0x0) {
        local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        QStack_70.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QMutexLocker<QBasicMutex>::QMutexLocker
                  ((QMutexLocker<QBasicMutex> *)local_78,
                   (QBasicMutex *)
                   ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
                   ((ulong)this & 0xffffffff) % 0x418));
        QObjectPrivate::ensureConnectionData((QObjectPrivate *)(this->d_ptr).d);
        pQVar6 = (this->d_ptr).d[1].parent;
        QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_78);
      }
      QStack_70.ptr = *(TimerInfoV2 **)&e[1].t;
      local_78 = (undefined1  [8])0x0;
      QStack_70.size = CONCAT44(0xaaaaaaaa,*(undefined4 *)&e[1]._vptr_QEvent);
      if (pQVar6 != (QObject *)0x0) {
        local_78 = (undefined1  [8])pQVar6[1].d_ptr.d;
        pQVar6[1].d_ptr.d = (QObjectData *)local_78;
      }
      QStack_70.d = (Data *)this;
      (*e->_vptr_QEvent[4])(e,this);
      if ((QObject *)QStack_70.d != (QObject *)0x0) {
        ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)((long)QStack_70.d + 8)
        )->d[1].parent[1].d_ptr.d = (QObjectData *)local_78;
      }
    }
    else if (uVar1 == 0x34) {
      (*this->_vptr_QObject[4])(this);
    }
    else if (uVar1 == 1) {
      (*this->_vptr_QObject[7])(this,e);
    }
    else {
      if (uVar1 < 1000) {
        bVar5 = false;
        goto LAB_00289bbb;
      }
      (*this->_vptr_QObject[9])(this,e);
    }
  }
  bVar5 = true;
LAB_00289bbb:
  if (*(QBindingStorageData **)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QObject::event(QEvent *e)
{
    switch (e->type()) {
    case QEvent::Timer:
        timerEvent((QTimerEvent *)e);
        break;

    case QEvent::ChildAdded:
    case QEvent::ChildPolished:
    case QEvent::ChildRemoved:
        childEvent((QChildEvent *)e);
        break;

    case QEvent::DeferredDelete:
        delete this;
        break;

    case QEvent::MetaCall:
        {
            QAbstractMetaCallEvent *mce = static_cast<QAbstractMetaCallEvent*>(e);

            QObjectPrivate::ConnectionData *connections = d_func()->connections.loadAcquire();
            if (!connections) {
                QMutexLocker locker(signalSlotLock(this));
                d_func()->ensureConnectionData();
                connections = d_func()->connections.loadRelaxed();
            }
            QObjectPrivate::Sender sender(this, const_cast<QObject*>(mce->sender()), mce->signalId(), connections);

            mce->placeMetaCall(this);
            break;
        }

    case QEvent::ThreadChange: {
        Q_D(QObject);
        QThreadData *threadData = d->threadData.loadRelaxed();
        QAbstractEventDispatcher *eventDispatcher = threadData->eventDispatcher.loadRelaxed();
        if (eventDispatcher) {
            QList<QAbstractEventDispatcher::TimerInfoV2> timers = eventDispatcher->timersForObject(this);
            if (!timers.isEmpty()) {
                const bool res = eventDispatcher->unregisterTimers(this);
                // do not to release our timer ids back to the pool (since the timer ids are moving to a new thread).
                Q_ASSERT_X(res, Q_FUNC_INFO,
                           "QAbstractEventDispatcher::unregisterTimers() returned false,"
                           " but there are timers associated with this object.");
                auto reRegisterTimers = [this, timers = std::move(timers)]() {
                    QAbstractEventDispatcher *eventDispatcher =
                            d_func()->threadData.loadRelaxed()->eventDispatcher.loadRelaxed();
                    for (const auto &ti : timers)
                        eventDispatcher->registerTimer(ti.timerId, ti.interval, ti.timerType, this);
                };
                QMetaObject::invokeMethod(this, std::move(reRegisterTimers), Qt::QueuedConnection);
            }
        }
        break;
    }

    default:
        if (e->type() >= QEvent::User) {
            customEvent(e);
            break;
        }
        return false;
    }
    return true;
}